

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDCLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDCImporter::InternReadFile
          (MDCImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  uchar *puVar1;
  BaseVertex *bvert;
  short sVar2;
  uint32_t uVar3;
  uchar *puVar4;
  bool bVar5;
  pointer pbVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  ulong uVar12;
  aiMesh **ppaVar13;
  ulong uVar14;
  aiMesh *paVar15;
  size_t sVar16;
  aiVector3D *__s;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  ulong *puVar17;
  aiFace *paVar18;
  uint *puVar19;
  Logger *this_00;
  Header *pHVar20;
  aiNode *paVar21;
  aiNode **ppaVar22;
  aiMaterial **ppaVar23;
  aiMaterial *this_01;
  long *plVar24;
  runtime_error *prVar25;
  size_type *psVar26;
  uint uVar27;
  char *pcVar28;
  long lVar29;
  uint uVar30;
  pointer pcVar31;
  Frame *pFVar32;
  aiFace *paVar33;
  Surface *pcSurf;
  float fVar34;
  float __x;
  float fVar35;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aszShaders;
  int iMode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  aiString path;
  Surface *local_4f0;
  uint local_4d8;
  char *local_4d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  uint *local_4b0;
  undefined8 local_4a8;
  undefined4 local_4a0;
  uint local_49c;
  float local_498;
  undefined4 local_494;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  ulong local_470;
  char *local_468;
  aiVector3D *local_460;
  Frame *local_458;
  ulong local_450;
  ulong local_448;
  aiFace *local_440;
  undefined1 local_438 [1032];
  
  pcVar31 = local_438 + 0x10;
  local_438._0_8_ = pcVar31;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"rb","");
  iVar9 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_438._0_8_);
  plVar24 = (long *)CONCAT44(extraout_var,iVar9);
  if ((pointer)local_438._0_8_ != pcVar31) {
    operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
  }
  if (plVar24 == (long *)0x0) {
    prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_490,"Failed to open MDC file ",pFile);
    plVar24 = (long *)std::__cxx11::string::append((char *)&local_490);
    local_438._0_8_ = *plVar24;
    psVar26 = (size_type *)(plVar24 + 2);
    if ((size_type *)local_438._0_8_ == psVar26) {
      local_438._16_8_ = *psVar26;
      local_438._24_8_ = plVar24[3];
      local_438._0_8_ = local_438 + 0x10;
    }
    else {
      local_438._16_8_ = *psVar26;
    }
    local_438._8_8_ = plVar24[1];
    *plVar24 = (long)psVar26;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    std::runtime_error::runtime_error(prVar25,(string *)local_438);
    *(undefined ***)prVar25 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar10 = (**(code **)(*plVar24 + 0x30))(plVar24);
  this->fileSize = uVar10;
  if ((uVar10 & 0xfffffff0) < 0x70) {
    prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = pcVar31;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"MDC File is too small.","")
    ;
    std::runtime_error::runtime_error(prVar25,(string *)local_438);
    *(undefined ***)prVar25 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_490,(ulong)uVar10,
             (allocator_type *)local_438);
  (**(code **)(*plVar24 + 0x10))(plVar24,local_490._M_dataplus._M_p,1,this->fileSize);
  this->mBuffer = (uchar *)local_490._M_dataplus._M_p;
  this->pcHeader = (Header *)local_490._M_dataplus._M_p;
  ValidateHeader(this);
  local_4c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = this->mBuffer;
  uVar10 = this->pcHeader->ulOffsetBorderFrames;
  uVar14 = (ulong)this->pcHeader->ulOffsetSurfaces;
  uVar11 = this->configFrameID;
  local_4f0 = (Surface *)(puVar4 + uVar14);
  puVar1 = puVar4 + uVar14;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1 = puVar4 + uVar14 + 0x43;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar4 + uVar14 + 0x53;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar4 + uVar14 + 99;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1 = puVar4 + uVar14 + 0x6c;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  uVar14 = 0;
  if (this->pcHeader->ulNumSurfaces != 0) {
    uVar30 = 0;
    pcSurf = local_4f0;
    do {
      ValidateSurfaceHeader(this,pcSurf);
      if ((pcSurf->ulNumVertices != 0) && (pcSurf->ulNumTriangles != 0)) {
        pScene->mNumMeshes = pScene->mNumMeshes + 1;
      }
      uVar27 = (int)uVar14 + pcSurf->ulNumShaders;
      uVar14 = (ulong)uVar27;
      uVar12 = (ulong)pcSurf->ulOffsetEnd;
      pcVar28 = pcSurf->ucName + (uVar12 - 4);
      pcVar28[0] = '\0';
      pcVar28[1] = '\0';
      pcVar28[2] = '\0';
      pcVar28[3] = '\0';
      pcVar28 = pcSurf->ucName + uVar12 + 0x3f;
      pcVar28[0] = '\0';
      pcVar28[1] = '\0';
      pcVar28[2] = '\0';
      pcVar28[3] = '\0';
      pcVar28[4] = '\0';
      pcVar28[5] = '\0';
      pcVar28[6] = '\0';
      pcVar28[7] = '\0';
      pcVar28[8] = '\0';
      pcVar28[9] = '\0';
      pcVar28[10] = '\0';
      pcVar28[0xb] = '\0';
      pcVar28[0xc] = '\0';
      pcVar28[0xd] = '\0';
      pcVar28[0xe] = '\0';
      pcVar28[0xf] = '\0';
      pcVar28 = pcSurf->ucName + uVar12 + 0x4f;
      pcVar28[0] = '\0';
      pcVar28[1] = '\0';
      pcVar28[2] = '\0';
      pcVar28[3] = '\0';
      pcVar28[4] = '\0';
      pcVar28[5] = '\0';
      pcVar28[6] = '\0';
      pcVar28[7] = '\0';
      pcVar28[8] = '\0';
      pcVar28[9] = '\0';
      pcVar28[10] = '\0';
      pcVar28[0xb] = '\0';
      pcVar28[0xc] = '\0';
      pcVar28[0xd] = '\0';
      pcVar28[0xe] = '\0';
      pcVar28[0xf] = '\0';
      pcVar28 = pcSurf->ucName + uVar12 + 0x5f;
      pcVar28[0] = '\0';
      pcVar28[1] = '\0';
      pcVar28[2] = '\0';
      pcVar28[3] = '\0';
      pcVar28[4] = '\0';
      pcVar28[5] = '\0';
      pcVar28[6] = '\0';
      pcVar28[7] = '\0';
      pcVar28[8] = '\0';
      pcVar28[9] = '\0';
      pcVar28[10] = '\0';
      pcVar28[0xb] = '\0';
      pcVar28[0xc] = '\0';
      pcVar28[0xd] = '\0';
      pcVar28[0xe] = '\0';
      pcVar28[0xf] = '\0';
      pcVar28 = pcSurf->ucName + uVar12 + 0x68;
      pcVar28[0] = '\0';
      pcVar28[1] = '\0';
      pcVar28[2] = '\0';
      pcVar28[3] = '\0';
      pcVar28[4] = '\0';
      pcVar28[5] = '\0';
      pcVar28[6] = '\0';
      pcVar28[7] = '\0';
      pcVar28[8] = '\0';
      pcVar28[9] = '\0';
      pcVar28[10] = '\0';
      pcVar28[0xb] = '\0';
      pcVar28[0xc] = '\0';
      pcVar28[0xd] = '\0';
      pcVar28[0xe] = '\0';
      pcVar28[0xf] = '\0';
      pcSurf = (Surface *)(pcSurf->ucName + (uVar12 - 4));
      uVar30 = uVar30 + 1;
    } while (uVar30 < this->pcHeader->ulNumSurfaces);
    uVar14 = (ulong)uVar27;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_4c8,uVar14);
  uVar30 = pScene->mNumMeshes;
  ppaVar13 = (aiMesh **)operator_new__((ulong)uVar30 * 8);
  pScene->mMeshes = ppaVar13;
  if (uVar30 == 0) {
    uVar30 = 0;
  }
  else {
    uVar14 = 0;
    do {
      pScene->mMeshes[uVar14] = (aiMesh *)0x0;
      uVar14 = uVar14 + 1;
      uVar30 = pScene->mNumMeshes;
    } while (uVar14 < uVar30);
  }
  pHVar20 = this->pcHeader;
  if (pHVar20->ulNumSurfaces != 0) {
    local_458 = (Frame *)(puVar4 + (ulong)uVar10 + (ulong)uVar11 * 0x38);
    local_470 = 0xffffffff;
    local_4d8 = 0;
    uVar10 = 0;
    do {
      pcVar31 = local_438 + 0x10;
      if ((local_4f0->ulNumVertices != 0) && (local_4f0->ulNumTriangles != 0)) {
        local_49c = uVar10;
        paVar15 = (aiMesh *)operator_new(0x520);
        paVar15->mPrimitiveTypes = 0;
        paVar15->mNumVertices = 0;
        paVar15->mNumFaces = 0;
        memset(&paVar15->mVertices,0,0xcc);
        paVar15->mBones = (aiBone **)0x0;
        paVar15->mMaterialIndex = 0;
        (paVar15->mName).length = 0;
        (paVar15->mName).data[0] = '\0';
        memset((paVar15->mName).data + 1,0x1b,0x3ff);
        paVar15->mNumAnimMeshes = 0;
        paVar15->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar15->mMethod = 0;
        (paVar15->mAABB).mMin.x = 0.0;
        (paVar15->mAABB).mMin.y = 0.0;
        (paVar15->mAABB).mMin.z = 0.0;
        (paVar15->mAABB).mMax.x = 0.0;
        (paVar15->mAABB).mMax.y = 0.0;
        (paVar15->mAABB).mMax.z = 0.0;
        memset(paVar15->mColors,0,0xa0);
        pScene->mMeshes[local_4d8] = paVar15;
        uVar10 = local_4f0->ulNumTriangles;
        paVar15->mNumFaces = uVar10;
        paVar15->mNumVertices = uVar10 * 3;
        sVar16 = strnlen(local_4f0->ucName,0x3f);
        local_438._0_8_ = pcVar31;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,local_4f0->ucName,local_4f0->ucName + sVar16);
        uVar8 = local_438._8_8_;
        uVar7 = local_438._0_8_;
        if ((ulong)local_438._8_8_ < 0x400) {
          (paVar15->mName).length = (ai_uint32)local_438._8_8_;
          memcpy((paVar15->mName).data,(void *)local_438._0_8_,local_438._8_8_);
          (paVar15->mName).data[uVar8] = '\0';
        }
        if ((pointer)uVar7 != pcVar31) {
          operator_delete((void *)uVar7,local_438._16_8_ + 1);
        }
        if (local_4f0->ulNumShaders == 0) {
          if ((uint)local_470 == 0xffffffff) {
            local_470 = (ulong)((long)local_4c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5;
            paVar15->mMaterialIndex = (uint)local_470;
            local_438._8_8_ = 0;
            local_438._16_8_ = local_438._16_8_ & 0xffffffffffffff00;
            local_438._0_8_ = pcVar31;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_438);
            goto LAB_00470572;
          }
          paVar15->mMaterialIndex = (uint)local_470;
        }
        else {
          pcVar28 = local_4f0->ucName + ((ulong)local_4f0->ulOffsetShaders - 4);
          paVar15->mMaterialIndex =
               (uint)((ulong)((long)local_4c8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_4c8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
          sVar16 = strnlen(pcVar28,0x40);
          local_438._0_8_ = pcVar31;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,pcVar28,pcVar28 + sVar16);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4c8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438
                    );
LAB_00470572:
          if ((pointer)local_438._0_8_ != pcVar31) {
            operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
          }
        }
        uVar10 = paVar15->mNumVertices;
        uVar14 = (ulong)uVar10 * 0xc;
        __s = (aiVector3D *)operator_new__(uVar14);
        if (uVar10 != 0) {
          memset(__s,0,((uVar14 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar15->mVertices = __s;
        __s_00 = (aiVector3D *)operator_new__(uVar14);
        if (uVar10 != 0) {
          memset(__s_00,0,((uVar14 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar15->mNormals = __s_00;
        __s_01 = (aiVector3D *)operator_new__(uVar14);
        if (uVar10 != 0) {
          memset(__s_01,0,((uVar14 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar15->mTextureCoords[0] = __s_01;
        uVar14 = (ulong)paVar15->mNumFaces;
        puVar17 = (ulong *)operator_new__(uVar14 * 0x10 + 8);
        *puVar17 = uVar14;
        paVar33 = (aiFace *)(puVar17 + 1);
        if (uVar14 != 0) {
          paVar18 = paVar33;
          do {
            paVar18->mNumIndices = 0;
            paVar18->mIndices = (uint *)0x0;
            paVar18 = paVar18 + 1;
          } while (paVar18 != paVar33 + uVar14);
        }
        paVar15->mFaces = paVar33;
        uVar3 = local_4f0->ulNumVertices;
        local_4b0 = (uint *)(ulong)local_4f0->ulOffsetTriangles;
        local_468 = (char *)(ulong)local_4f0->ulOffsetTexCoords;
        uVar14 = (ulong)this->configFrameID;
        sVar2 = *(short *)(local_4f0->ucName +
                          uVar14 * 2 + (ulong)local_4f0->ulOffsetFrameBaseFrames + -4);
        uVar10 = local_4f0->ulOffsetBaseVerts;
        bVar5 = true;
        if (((uVar14 == 0) || (local_4f0->ulNumCompFrames == 0)) ||
           (*(short *)(local_4f0->ucName +
                      uVar14 * 2 + (ulong)local_4f0->ulOffsetFrameCompFrames + -4) < 0)) {
          local_4d0 = (char *)0x0;
        }
        else {
          local_4d0 = local_4f0->ucName +
                      (ulong)((int)*(short *)(local_4f0->ucName +
                                             uVar14 * 2 + (ulong)local_4f0->ulOffsetFrameCompFrames
                                             + -4) * uVar3) * 4 +
                      (ulong)local_4f0->ulOffsetCompVerts + -4;
          bVar5 = false;
        }
        local_460 = __s_01;
        if (local_4f0->ulNumTriangles != 0) {
          local_4b0 = (uint *)((long)local_4b0 + (long)local_4f0);
          local_468 = local_4f0->ucName + (long)(local_468 + -4);
          uVar14 = 0;
          do {
            paVar33->mNumIndices = 3;
            puVar19 = (uint *)operator_new__(0xc);
            local_450 = (ulong)(uint)((int)uVar14 * 3);
            paVar33->mIndices = puVar19;
            lVar29 = 0;
            puVar19 = local_4b0;
            local_448 = uVar14;
            local_440 = paVar33;
            do {
              uVar11 = *puVar19;
              if (local_4f0->ulNumVertices <= uVar11) {
                this_00 = DefaultLogger::get();
                Logger::error(this_00,"MDC vertex index is out of range");
                uVar11 = local_4f0->ulNumVertices - 1;
              }
              pFVar32 = local_458;
              uVar14 = (ulong)uVar11;
              bvert = (BaseVertex *)
                      (local_4f0->ucName +
                      uVar14 * 8 + (ulong)((int)sVar2 * uVar3 * 4) * 8 + (ulong)uVar10 + -4);
              if (bVar5) {
                *(float *)((long)&__s->x + lVar29) = (float)(int)bvert->x * 0.015625;
                *(float *)((long)&__s->y + lVar29) = (float)(int)bvert->y * 0.015625;
                *(float *)((long)&__s->z + lVar29) = (float)(int)bvert->z * 0.015625;
                fVar35 = (float)(bvert->normal >> 8) * 0.024546297;
                __x = (float)(byte)bvert->normal * 0.024546297;
                local_498 = cosf(fVar35);
                fVar34 = sinf(__x);
                *(float *)((long)&__s_00->x + lVar29) = fVar34 * local_498;
                fVar34 = sinf(fVar35);
                fVar35 = sinf(__x);
                *(float *)((long)&__s_00->y + lVar29) = fVar35 * fVar34;
                fVar34 = cosf(__x);
                *(float *)((long)&__s_00->z + lVar29) = fVar34;
                *(undefined4 *)((long)&local_460->x + lVar29) =
                     *(undefined4 *)(local_468 + uVar14 * 8);
                *(float *)((long)&local_460->y + lVar29) =
                     1.0 - *(float *)(local_468 + uVar14 * 8 + 4);
                pFVar32 = local_458;
              }
              else {
                MDC::BuildVertex(local_458,bvert,(CompressedVertex *)(local_4d0 + uVar14 * 4),
                                 (aiVector3D *)((long)&__s->x + lVar29),
                                 (aiVector3D *)((long)&__s_00->x + lVar29));
              }
              *(float *)((long)&__s->x + lVar29) =
                   (pFVar32->localOrigin).x + *(float *)((long)&__s->x + lVar29);
              *(float *)((long)&__s->y + lVar29) =
                   (pFVar32->localOrigin).y + *(float *)((long)&__s->y + lVar29);
              *(float *)((long)&__s->z + lVar29) =
                   (pFVar32->localOrigin).z + *(float *)((long)&__s->z + lVar29);
              puVar19 = puVar19 + 1;
              lVar29 = lVar29 + 0xc;
            } while (lVar29 != 0x24);
            uVar11 = (uint)local_450;
            *local_440->mIndices = uVar11 + 2;
            local_440->mIndices[1] = uVar11 + 1;
            local_440->mIndices[2] = uVar11;
            uVar11 = (int)local_448 + 1;
            uVar14 = (ulong)uVar11;
            local_4b0 = local_4b0 + 3;
            paVar33 = local_440 + 1;
            local_460 = local_460 + 3;
            __s_00 = __s_00 + 3;
            __s = __s + 3;
          } while (uVar11 < local_4f0->ulNumTriangles);
        }
        local_4d8 = local_4d8 + 1;
        uVar14 = (ulong)local_4f0->ulOffsetEnd;
        pcVar28 = local_4f0->ucName + (uVar14 - 4);
        pcVar28[0] = '\0';
        pcVar28[1] = '\0';
        pcVar28[2] = '\0';
        pcVar28[3] = '\0';
        pcVar28 = local_4f0->ucName + uVar14 + 0x3f;
        pcVar28[0] = '\0';
        pcVar28[1] = '\0';
        pcVar28[2] = '\0';
        pcVar28[3] = '\0';
        pcVar28[4] = '\0';
        pcVar28[5] = '\0';
        pcVar28[6] = '\0';
        pcVar28[7] = '\0';
        pcVar28[8] = '\0';
        pcVar28[9] = '\0';
        pcVar28[10] = '\0';
        pcVar28[0xb] = '\0';
        pcVar28[0xc] = '\0';
        pcVar28[0xd] = '\0';
        pcVar28[0xe] = '\0';
        pcVar28[0xf] = '\0';
        pcVar28 = local_4f0->ucName + uVar14 + 0x4f;
        pcVar28[0] = '\0';
        pcVar28[1] = '\0';
        pcVar28[2] = '\0';
        pcVar28[3] = '\0';
        pcVar28[4] = '\0';
        pcVar28[5] = '\0';
        pcVar28[6] = '\0';
        pcVar28[7] = '\0';
        pcVar28[8] = '\0';
        pcVar28[9] = '\0';
        pcVar28[10] = '\0';
        pcVar28[0xb] = '\0';
        pcVar28[0xc] = '\0';
        pcVar28[0xd] = '\0';
        pcVar28[0xe] = '\0';
        pcVar28[0xf] = '\0';
        pcVar28 = local_4f0->ucName + uVar14 + 0x5f;
        pcVar28[0] = '\0';
        pcVar28[1] = '\0';
        pcVar28[2] = '\0';
        pcVar28[3] = '\0';
        pcVar28[4] = '\0';
        pcVar28[5] = '\0';
        pcVar28[6] = '\0';
        pcVar28[7] = '\0';
        pcVar28[8] = '\0';
        pcVar28[9] = '\0';
        pcVar28[10] = '\0';
        pcVar28[0xb] = '\0';
        pcVar28[0xc] = '\0';
        pcVar28[0xd] = '\0';
        pcVar28[0xe] = '\0';
        pcVar28[0xf] = '\0';
        pcVar28 = local_4f0->ucName + uVar14 + 0x68;
        pcVar28[0] = '\0';
        pcVar28[1] = '\0';
        pcVar28[2] = '\0';
        pcVar28[3] = '\0';
        pcVar28[4] = '\0';
        pcVar28[5] = '\0';
        pcVar28[6] = '\0';
        pcVar28[7] = '\0';
        pcVar28[8] = '\0';
        pcVar28[9] = '\0';
        pcVar28[10] = '\0';
        pcVar28[0xb] = '\0';
        pcVar28[0xc] = '\0';
        pcVar28[0xd] = '\0';
        pcVar28[0xe] = '\0';
        pcVar28[0xf] = '\0';
        local_4f0 = (Surface *)(local_4f0->ucName + (uVar14 - 4));
        pHVar20 = this->pcHeader;
        uVar10 = local_49c;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < pHVar20->ulNumSurfaces);
    uVar30 = pScene->mNumMeshes;
  }
  if (uVar30 == 1) {
    paVar21 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar21);
    pScene->mRootNode = paVar21;
    paVar15 = *pScene->mMeshes;
    if (paVar15 != (aiMesh *)0x0) {
      if (paVar21 != (aiNode *)&paVar15->mName) {
        uVar10 = (paVar15->mName).length;
        (paVar21->mName).length = uVar10;
        memcpy((paVar21->mName).data,(paVar15->mName).data,(ulong)uVar10);
        (paVar21->mName).data[uVar10] = '\0';
      }
      paVar21->mNumMeshes = 1;
      puVar19 = (uint *)operator_new__(4);
      paVar21->mMeshes = puVar19;
      *puVar19 = 0;
    }
  }
  else {
    if (uVar30 == 0) {
      prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_438._0_8_ = local_438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Invalid MDC file: File contains no valid mesh","");
      std::runtime_error::runtime_error(prVar25,(string *)local_438);
      *(undefined ***)prVar25 = &PTR__runtime_error_0080bf48;
      __cxa_throw(prVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar21 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar21);
    pScene->mRootNode = paVar21;
    uVar10 = pScene->mNumMeshes;
    paVar21->mNumChildren = uVar10;
    ppaVar22 = (aiNode **)operator_new__((ulong)uVar10 << 3);
    paVar21->mChildren = ppaVar22;
    (paVar21->mName).length = 6;
    builtin_strncpy((paVar21->mName).data,"<root>",7);
    if (uVar10 != 0) {
      uVar14 = 0;
      do {
        paVar21 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar21);
        pScene->mRootNode->mChildren[uVar14] = paVar21;
        paVar21->mParent = pScene->mRootNode;
        paVar15 = pScene->mMeshes[uVar14];
        if (paVar21 != (aiNode *)&paVar15->mName) {
          uVar10 = (paVar15->mName).length;
          (paVar21->mName).length = uVar10;
          memcpy((paVar21->mName).data,(paVar15->mName).data,(ulong)uVar10);
          (paVar21->mName).data[uVar10] = '\0';
        }
        paVar21->mNumMeshes = 1;
        puVar19 = (uint *)operator_new__(4);
        paVar21->mMeshes = puVar19;
        *puVar19 = (uint)uVar14;
        uVar14 = uVar14 + 1;
      } while (uVar14 < pScene->mNumMeshes);
    }
  }
  uVar10 = (uint)((ulong)((long)local_4c8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_4c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
  pScene->mNumMaterials = uVar10;
  ppaVar23 = (aiMaterial **)
             operator_new__((ulong)((long)local_4c8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_4c8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                            0x7fffffff8);
  pScene->mMaterials = ppaVar23;
  if (uVar10 != 0) {
    lVar29 = 8;
    uVar14 = 0;
    do {
      this_01 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_01);
      pbVar6 = local_4c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pScene->mMaterials[uVar14] = this_01;
      local_494 = 2;
      aiMaterial::AddBinaryProperty(this_01,&local_494,4,"$mat.shadingm",0,0,aiPTI_Integer);
      local_4a8 = 0x3d4ccccd3d4ccccd;
      local_4a0 = 0x3d4ccccd;
      aiMaterial::AddBinaryProperty(this_01,&local_4a8,0xc,"$clr.ambient",0,0,aiPTI_Float);
      local_4a0 = *(undefined4 *)
                   (&DAT_006c7fc8 +
                   (ulong)(*(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar29) == 0) * 4);
      local_4a8 = CONCAT44(local_4a0,local_4a0);
      aiMaterial::AddBinaryProperty(this_01,&local_4a8,0xc,"$clr.diffuse",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty(this_01,&local_4a8,0xc,"$clr.specular",0,0,aiPTI_Float);
      if (*(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar29) != 0) {
        local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
        memset(local_438 + 5,0x1b,0x3ff);
        uVar12 = *(ulong *)((long)&(pbVar6->_M_dataplus)._M_p + lVar29);
        if (uVar12 < 0x400) {
          local_438._0_4_ = (int)uVar12;
          memcpy(local_438 + 4,*(void **)((long)pbVar6 + lVar29 + -8),uVar12);
          local_438[uVar12 + 4] = 0;
        }
        aiMaterial::AddProperty(this_01,(aiString *)local_438,"$tex.file",1,0);
      }
      uVar14 = uVar14 + 1;
      lVar29 = lVar29 + 0x20;
    } while (uVar14 < pScene->mNumMaterials);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8);
  if ((Header *)local_490._M_dataplus._M_p != (Header *)0x0) {
    operator_delete(local_490._M_dataplus._M_p,
                    local_490.field_2._M_allocated_capacity - (long)local_490._M_dataplus._M_p);
  }
  (**(code **)(*plVar24 + 8))();
  return;
}

Assistant:

void MDCImporter::InternReadFile(
    const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MDC file " + pFile + ".");

    // check whether the mdc file is large enough to contain the file header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MDC::Header))
        throw DeadlyImportError( "MDC File is too small.");

    std::vector<unsigned char> mBuffer2(fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    // validate the file header
    this->pcHeader = (BE_NCONST MDC::Header*)this->mBuffer;
    this->ValidateHeader();

    std::vector<std::string> aszShaders;

    // get a pointer to the frame we want to read
    BE_NCONST MDC::Frame* pcFrame = (BE_NCONST MDC::Frame*)(this->mBuffer+
        this->pcHeader->ulOffsetBorderFrames);

    // no need to swap the other members, we won't need them
    pcFrame += configFrameID;
    AI_SWAP4( pcFrame->localOrigin[0] );
    AI_SWAP4( pcFrame->localOrigin[1] );
    AI_SWAP4( pcFrame->localOrigin[2] );

    // get the number of valid surfaces
    BE_NCONST MDC::Surface* pcSurface, *pcSurface2;
    pcSurface = pcSurface2 = new (mBuffer + pcHeader->ulOffsetSurfaces) MDC::Surface;
    unsigned int iNumShaders = 0;
    for (unsigned int i = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        // validate the surface header
        this->ValidateSurfaceHeader(pcSurface2);

        if (pcSurface2->ulNumVertices && pcSurface2->ulNumTriangles)++pScene->mNumMeshes;
        iNumShaders += pcSurface2->ulNumShaders;
        pcSurface2 = new ((int8_t*)pcSurface2 + pcSurface2->ulOffsetEnd) MDC::Surface;
    }
    aszShaders.reserve(iNumShaders);
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    // necessary that we don't crash if an exception occurs
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mMeshes[i] = NULL;

    // now read all surfaces
    unsigned int iDefaultMatIndex = UINT_MAX;
    for (unsigned int i = 0, iNum = 0; i < pcHeader->ulNumSurfaces;++i)
    {
        if (!pcSurface->ulNumVertices || !pcSurface->ulNumTriangles)continue;
        aiMesh* pcMesh = pScene->mMeshes[iNum++] = new aiMesh();

        pcMesh->mNumFaces = pcSurface->ulNumTriangles;
        pcMesh->mNumVertices = pcMesh->mNumFaces * 3;

        // store the name of the surface for use as node name.
        pcMesh->mName.Set(std::string(pcSurface->ucName
                                    , strnlen(pcSurface->ucName, AI_MDC_MAXQPATH - 1)));

        // go to the first shader in the file. ignore the others.
        if (pcSurface->ulNumShaders)
        {
            const MDC::Shader* pcShader = (const MDC::Shader*)((int8_t*)pcSurface + pcSurface->ulOffsetShaders);
            pcMesh->mMaterialIndex = (unsigned int)aszShaders.size();

            // create a new shader
            aszShaders.push_back(std::string( pcShader->ucName, 
                ::strnlen(pcShader->ucName, sizeof(pcShader->ucName)) ));
        }
        // need to create a default material
        else if (UINT_MAX == iDefaultMatIndex)
        {
            pcMesh->mMaterialIndex = iDefaultMatIndex = (unsigned int)aszShaders.size();
            aszShaders.push_back(std::string());
        }
        // otherwise assign a reference to the default material
        else pcMesh->mMaterialIndex = iDefaultMatIndex;

        // allocate output storage for the mesh
        aiVector3D* pcVertCur   = pcMesh->mVertices         = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcNorCur    = pcMesh->mNormals          = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcUVCur     = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        aiFace* pcFaceCur       = pcMesh->mFaces            = new aiFace[pcMesh->mNumFaces];

        // create all vertices/faces
        BE_NCONST MDC::Triangle* pcTriangle = (BE_NCONST MDC::Triangle*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTriangles);

        BE_NCONST MDC::TexturCoord* const pcUVs = (BE_NCONST MDC::TexturCoord*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetTexCoords);

        // get a pointer to the uncompressed vertices
        int16_t iOfs = *((int16_t*) ((int8_t*) pcSurface +
            pcSurface->ulOffsetFrameBaseFrames) +  this->configFrameID);

        AI_SWAP2(iOfs);

        BE_NCONST MDC::BaseVertex* const pcVerts = (BE_NCONST MDC::BaseVertex*)
            ((int8_t*)pcSurface+pcSurface->ulOffsetBaseVerts) +
            ((int)iOfs * pcSurface->ulNumVertices * 4);

        // do the main swapping stuff ...
#if (defined AI_BUILD_BIG_ENDIAN)

        // swap all triangles
        for (unsigned int i = 0; i < pcSurface->ulNumTriangles;++i)
        {
            AI_SWAP4( pcTriangle[i].aiIndices[0] );
            AI_SWAP4( pcTriangle[i].aiIndices[1] );
            AI_SWAP4( pcTriangle[i].aiIndices[2] );
        }

        // swap all vertices
        for (unsigned int i = 0; i < pcSurface->ulNumVertices*pcSurface->ulNumBaseFrames;++i)
        {
            AI_SWAP2( pcVerts->normal );
            AI_SWAP2( pcVerts->x );
            AI_SWAP2( pcVerts->y );
            AI_SWAP2( pcVerts->z );
        }

        // swap all texture coordinates
        for (unsigned int i = 0; i < pcSurface->ulNumVertices;++i)
        {
            AI_SWAP4( pcUVs->u );
            AI_SWAP4( pcUVs->v );
        }

#endif

        const MDC::CompressedVertex* pcCVerts = NULL;
        int16_t* mdcCompVert = NULL;

        // access compressed frames for large frame numbers, but never for the first
        if( this->configFrameID && pcSurface->ulNumCompFrames > 0 )
        {
            mdcCompVert = (int16_t*) ((int8_t*)pcSurface+pcSurface->ulOffsetFrameCompFrames) + this->configFrameID;
            AI_SWAP2P(mdcCompVert);
            if( *mdcCompVert >= 0 )
            {
                pcCVerts = (const MDC::CompressedVertex*)((int8_t*)pcSurface +
                    pcSurface->ulOffsetCompVerts) + *mdcCompVert * pcSurface->ulNumVertices;
            }
            else mdcCompVert = NULL;
        }

        // copy all faces
        for (unsigned int iFace = 0; iFace < pcSurface->ulNumTriangles;++iFace,
            ++pcTriangle,++pcFaceCur)
        {
            const unsigned int iOutIndex = iFace*3;
            pcFaceCur->mNumIndices = 3;
            pcFaceCur->mIndices = new unsigned int[3];

            for (unsigned int iIndex = 0; iIndex < 3;++iIndex,
                ++pcVertCur,++pcUVCur,++pcNorCur)
            {
                uint32_t quak = pcTriangle->aiIndices[iIndex];
                if (quak >= pcSurface->ulNumVertices)
                {
                    ASSIMP_LOG_ERROR("MDC vertex index is out of range");
                    quak = pcSurface->ulNumVertices-1;
                }

                // compressed vertices?
                if (mdcCompVert)
                {
                    MDC::BuildVertex(*pcFrame,pcVerts[quak],pcCVerts[quak],
                        *pcVertCur,*pcNorCur);
                }
                else
                {
                    // copy position
                    pcVertCur->x = pcVerts[quak].x * AI_MDC_BASE_SCALING;
                    pcVertCur->y = pcVerts[quak].y * AI_MDC_BASE_SCALING;
                    pcVertCur->z = pcVerts[quak].z * AI_MDC_BASE_SCALING;

                    // copy normals
                    MD3::LatLngNormalToVec3( pcVerts[quak].normal, &pcNorCur->x );

                    // copy texture coordinates
                    pcUVCur->x = pcUVs[quak].u;
                    pcUVCur->y = ai_real( 1.0 )-pcUVs[quak].v; // DX to OGL
                }
                pcVertCur->x += pcFrame->localOrigin[0] ;
                pcVertCur->y += pcFrame->localOrigin[1] ;
                pcVertCur->z += pcFrame->localOrigin[2] ;
            }

            // swap the face order - DX to OGL
            pcFaceCur->mIndices[0] = iOutIndex + 2;
            pcFaceCur->mIndices[1] = iOutIndex + 1;
            pcFaceCur->mIndices[2] = iOutIndex + 0;
        }

        pcSurface =  new ((int8_t*)pcSurface + pcSurface->ulOffsetEnd) MDC::Surface;
    }

    // create a flat node graph with a root node and one child for each surface
    if (!pScene->mNumMeshes)
        throw DeadlyImportError( "Invalid MDC file: File contains no valid mesh");
    else if (1 == pScene->mNumMeshes)
    {
        pScene->mRootNode = new aiNode();
        if ( nullptr != pScene->mMeshes[0] ) {
            pScene->mRootNode->mName = pScene->mMeshes[0]->mName;
            pScene->mRootNode->mNumMeshes = 1;
            pScene->mRootNode->mMeshes = new unsigned int[1];
            pScene->mRootNode->mMeshes[0] = 0;
        }
    }
    else
    {
        pScene->mRootNode = new aiNode();
        pScene->mRootNode->mNumChildren = pScene->mNumMeshes;
        pScene->mRootNode->mChildren = new aiNode*[pScene->mNumMeshes];
        pScene->mRootNode->mName.Set("<root>");
        for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        {
            aiNode* pcNode = pScene->mRootNode->mChildren[i] = new aiNode();
            pcNode->mParent = pScene->mRootNode;
            pcNode->mName = pScene->mMeshes[i]->mName;
            pcNode->mNumMeshes = 1;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
        }
    }

    // create materials
    pScene->mNumMaterials = (unsigned int)aszShaders.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[i] = pcMat;

        const std::string& name = aszShaders[i];

        int iMode = (int)aiShadingMode_Gouraud;
        pcMat->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // add a small ambient color value - RtCW seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        if (name.length())clr.b = clr.g = clr.r = 1.0f;
        else clr.b = clr.g = clr.r = 0.6f;

        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcMat->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        if (name.length())
        {
            aiString path;
            path.Set(name);
            pcMat->AddProperty(&path,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }
}